

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  App *this_00;
  bool bVar1;
  ulong uVar2;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2a0;
  string local_288 [32];
  string local_268 [32];
  anon_class_24_3_0701af66 local_248;
  function<bool_(const_CLI::Option_*)> local_230;
  undefined1 local_210 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  string *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  ostream local_1a0 [380];
  AppFormatMode local_24;
  App *pAStack_20;
  AppFormatMode mode_local;
  App *app_local;
  Formatter *this_local;
  
  local_24 = mode;
  pAStack_20 = app;
  app_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &groups.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  App::get_groups_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8,pAStack_20);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8);
  group = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&group);
    if (!bVar1) break;
    local_248.group =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    this_00 = pAStack_20;
    local_248.app = pAStack_20;
    local_248.mode = local_24;
    opts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_248.group;
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_groups[abi:cxx11](CLI::App_const*,CLI::AppFormatMode)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool(CLI::Option_const*)> *)&local_230,&local_248);
    App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_210,
                     this_00,&local_230);
    std::function<bool_(const_CLI::Option_*)>::~function(&local_230);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                        ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         local_210);
      if (!bVar1) {
        ::std::__cxx11::string::string
                  (local_288,
                   (string *)
                   opts.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                  (&local_2a0,
                   (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_210);
        (*(this->super_FormatterBase)._vptr_FormatterBase[3])(local_268,this,local_288,0,&local_2a0)
        ;
        ::std::operator<<(local_1a0,local_268);
        ::std::__cxx11::string::~string(local_268);
        std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector(&local_2a0);
        ::std::__cxx11::string::~string(local_288);
      }
    }
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_210);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  ::std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  ::std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &groups.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                     // Must be in the right group
                   && opt->nonpositional()                       // Must not be a positional
                   && (mode != AppFormatMode::Sub                // If mode is Sub, then
                       || (app->get_help_ptr() != opt            // Ignore help pointer
                           && app->get_help_all_ptr() != opt));  // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            // Removed double newline between groups for consistency of help text
            // if(group != groups.back())
            //    out << "\n";
        }
    }

    return out.str();
}